

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

GetShapeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_getshape(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  GetShapeLayerParams *pGVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_getshape(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_getshape(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pGVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::GetShapeLayerParams>(arena);
    (this->layer_).getshape_ = pGVar2;
  }
  return (GetShapeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GetShapeLayerParams* NeuralNetworkLayer::_internal_mutable_getshape() {
  if (!_internal_has_getshape()) {
    clear_layer();
    set_has_getshape();
    layer_.getshape_ = CreateMaybeMessage< ::CoreML::Specification::GetShapeLayerParams >(GetArenaForAllocation());
  }
  return layer_.getshape_;
}